

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,unsigned_long value)

{
  ostringstream *this_00;
  ostringstream oss;
  ostringstream local_190 [376];
  
  this_00 = local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if ((Catch *)0x2000 < this) {
    this_00 = (ostringstream *)std::operator<<((ostream *)local_190,"0x");
    *(uint *)((ostream *)this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) =
         *(uint *)((ostream *)this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x18) & 0xffffffb5 | 8
    ;
  }
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString( unsigned long value ) {
    std::ostringstream oss;
    if( value > 8192 )
        oss << "0x" << std::hex << value;
    else
        oss << value;
    return oss.str();
}